

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O0

Ref<anurbs::Line<2L>_> __thiscall
anurbs::Model::replace<anurbs::Line<2l>>(Model *this,size_t index,Pointer<anurbs::Line<2L>_> *data)

{
  bool bVar1;
  invalid_argument *this_00;
  element_type *this_01;
  shared_ptr<anurbs::Line<2L>_> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Line<2L>_> RVar2;
  shared_ptr<anurbs::Entry<anurbs::Line<2L>_>_> local_68;
  shared_ptr<anurbs::Line<2L>_> local_58;
  undefined1 local_48 [8];
  shared_ptr<anurbs::Entry<anurbs::Line<2L>_>_> entry;
  Pointer<anurbs::Line<2L>_> *data_local;
  size_t index_local;
  Model *this_local;
  
  bVar1 = std::operator==(in_RCX,(nullptr_t)0x0);
  if (!bVar1) {
    std::
    vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
    ::at((vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
          *)index,(size_type)data);
    std::static_pointer_cast<anurbs::Entry<anurbs::Line<2l>>,anurbs::EntryBase>
              ((shared_ptr<anurbs::EntryBase> *)local_48);
    this_01 = std::
              __shared_ptr_access<anurbs::Entry<anurbs::Line<2L>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<anurbs::Entry<anurbs::Line<2L>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
    std::shared_ptr<anurbs::Line<2L>_>::shared_ptr(&local_58,in_RCX);
    Entry<anurbs::Line<2L>_>::set_data(this_01,&local_58);
    std::shared_ptr<anurbs::Line<2L>_>::~shared_ptr(&local_58);
    std::shared_ptr<anurbs::Entry<anurbs::Line<2L>_>_>::shared_ptr
              (&local_68,(shared_ptr<anurbs::Entry<anurbs::Line<2L>_>_> *)local_48);
    Ref<anurbs::Line<2L>_>::Ref((Ref<anurbs::Line<2L>_> *)this,&local_68);
    std::shared_ptr<anurbs::Entry<anurbs::Line<2L>_>_>::~shared_ptr(&local_68);
    std::shared_ptr<anurbs::Entry<anurbs::Line<2L>_>_>::~shared_ptr
              ((shared_ptr<anurbs::Entry<anurbs::Line<2L>_>_> *)local_48);
    RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Line<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = extraout_RDX._M_pi;
    RVar2.m_entry.super___shared_ptr<anurbs::Entry<anurbs::Line<2L>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)this;
    return (Ref<anurbs::Line<2L>_>)
           RVar2.m_entry.
           super___shared_ptr<anurbs::Entry<anurbs::Line<2L>_>,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"Data is null");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Ref<TData> replace(size_t index, Pointer<TData> data)
    {
        if (data == nullptr) {
            throw std::invalid_argument("Data is null");
        }

        auto entry = std::static_pointer_cast<Entry<TData>>(
            m_entries.at(index));
        
        entry->set_data(data);

        return Ref<TData>(entry);
    }